

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void heightOfExprList(ExprList *p,int *pnHeight)

{
  int iVar1;
  ExprList_item *pEVar2;
  long lVar3;
  
  if ((p != (ExprList *)0x0) && (0 < p->nExpr)) {
    pEVar2 = p->a;
    lVar3 = 0;
    do {
      if ((pEVar2->pExpr != (Expr *)0x0) && (iVar1 = pEVar2->pExpr->nHeight, *pnHeight < iVar1)) {
        *pnHeight = iVar1;
      }
      lVar3 = lVar3 + 1;
      pEVar2 = pEVar2 + 1;
    } while (lVar3 < p->nExpr);
  }
  return;
}

Assistant:

static void heightOfExprList(ExprList *p, int *pnHeight){
  if( p ){
    int i;
    for(i=0; i<p->nExpr; i++){
      heightOfExpr(p->a[i].pExpr, pnHeight);
    }
  }
}